

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O1

int Abc_NtkClauseMux(sat_solver *pSat,Abc_Obj_t *pNode,Abc_Obj_t *pNodeC,Abc_Obj_t *pNodeT,
                    Abc_Obj_t *pNodeE,Vec_Int_t *vVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint Entry;
  int iVar4;
  uint Entry_00;
  uint Entry_01;
  uint uVar5;
  uint Entry_02;
  uint uVar6;
  int Entry_03;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                  ,0x125,
                  "int Abc_NtkClauseMux(sat_solver *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                 );
  }
  iVar4 = Abc_NodeIsMuxType(pNode);
  if (iVar4 == 0) {
    __assert_fail("Abc_NodeIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                  ,0x126,
                  "int Abc_NtkClauseMux(sat_solver *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                 );
  }
  iVar4 = (pNode->field_6).iTemp;
  iVar1 = (pNodeC->field_6).iTemp;
  iVar2 = *(int *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x40);
  iVar3 = *(int *)(((ulong)pNodeE & 0xfffffffffffffffe) + 0x40);
  uVar5 = (uint)pNodeT & 1;
  vVars->nSize = 0;
  Entry_03 = iVar1 * 2 + 1;
  Vec_IntPush(vVars,Entry_03);
  Entry_00 = uVar5 + iVar2 * 2 ^ 1;
  Vec_IntPush(vVars,Entry_00);
  Entry = iVar4 * 2;
  Vec_IntPush(vVars,Entry);
  iVar4 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
  if (iVar4 != 0) {
    vVars->nSize = 0;
    Vec_IntPush(vVars,Entry_03);
    uVar5 = iVar2 * 2 | uVar5;
    Vec_IntPush(vVars,uVar5);
    Entry_02 = Entry | 1;
    Vec_IntPush(vVars,Entry_02);
    iVar4 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar4 != 0) {
      uVar6 = (uint)pNodeE & 1;
      iVar1 = iVar1 * 2;
      vVars->nSize = 0;
      Vec_IntPush(vVars,iVar1);
      Entry_01 = uVar6 + iVar3 * 2 ^ 1;
      Vec_IntPush(vVars,Entry_01);
      Vec_IntPush(vVars,Entry);
      iVar4 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
      if (iVar4 != 0) {
        vVars->nSize = 0;
        Vec_IntPush(vVars,iVar1);
        uVar6 = iVar3 * 2 | uVar6;
        Vec_IntPush(vVars,uVar6);
        Vec_IntPush(vVars,Entry_02);
        iVar4 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
        if (iVar4 != 0) {
          if (iVar2 == iVar3) {
            return 1;
          }
          vVars->nSize = 0;
          Vec_IntPush(vVars,uVar5);
          Vec_IntPush(vVars,uVar6);
          Vec_IntPush(vVars,Entry_02);
          iVar4 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
          if (iVar4 != 0) {
            vVars->nSize = 0;
            Vec_IntPush(vVars,Entry_00);
            Vec_IntPush(vVars,Entry_01);
            Vec_IntPush(vVars,Entry);
            iVar4 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
            return iVar4;
          }
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Abc_NtkClauseMux( sat_solver * pSat, Abc_Obj_t * pNode, Abc_Obj_t * pNodeC, Abc_Obj_t * pNodeT, Abc_Obj_t * pNodeE, Vec_Int_t * vVars )
{
    int VarF, VarI, VarT, VarE, fCompT, fCompE;
//printf( "Adding mux %d.         %d\n", pNode->Id, (int)pSat->sat_solver_stats.clauses );

    assert( !Abc_ObjIsComplement( pNode ) );
    assert( Abc_NodeIsMuxType( pNode ) );
    // get the variable numbers
    VarF = (int)(ABC_PTRINT_T)pNode->pCopy;
    VarI = (int)(ABC_PTRINT_T)pNodeC->pCopy;
    VarT = (int)(ABC_PTRINT_T)Abc_ObjRegular(pNodeT)->pCopy;
    VarE = (int)(ABC_PTRINT_T)Abc_ObjRegular(pNodeE)->pCopy;
//    VarF = (int)pNode->Id;
//    VarI = (int)pNodeC->Id;
//    VarT = (int)Abc_ObjRegular(pNodeT)->Id;
//    VarE = (int)Abc_ObjRegular(pNodeE)->Id;

    // get the complementation flags
    fCompT = Abc_ObjIsComplement(pNodeT);
    fCompE = Abc_ObjIsComplement(pNodeE);

    // f = ITE(i, t, e)
    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'
    // create four clauses
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarI,  1) );
    Vec_IntPush( vVars, toLitCond(VarT,  1^fCompT) );
    Vec_IntPush( vVars, toLitCond(VarF,  0) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarI,  1) );
    Vec_IntPush( vVars, toLitCond(VarT,  0^fCompT) );
    Vec_IntPush( vVars, toLitCond(VarF,  1) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarI,  0) );
    Vec_IntPush( vVars, toLitCond(VarE,  1^fCompE) );
    Vec_IntPush( vVars, toLitCond(VarF,  0) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarI,  0) );
    Vec_IntPush( vVars, toLitCond(VarE,  0^fCompE) );
    Vec_IntPush( vVars, toLitCond(VarF,  1) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
 
    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return 1;
    }

    // two additional clauses
    // t' & e' -> f'       t  + e   + f'
    // t  & e  -> f        t' + e'  + f 
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarT,  0^fCompT) );
    Vec_IntPush( vVars, toLitCond(VarE,  0^fCompE) );
    Vec_IntPush( vVars, toLitCond(VarF,  1) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarT,  1^fCompT) );
    Vec_IntPush( vVars, toLitCond(VarE,  1^fCompE) );
    Vec_IntPush( vVars, toLitCond(VarF,  0) );
    return sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
}